

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deRandom.hpp
# Opt level: O2

InputType __thiscall
de::Random::
chooseWeighted<deqp::gls::DrawTestSpec::InputType,deqp::gls::DrawTestSpec::InputType_const*,float_const*>
          (Random *this,InputType *first,InputType *last,float *weight)

{
  InputType *pIVar1;
  int iVar2;
  InputType *pIVar3;
  InputType *pIVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  fVar5 = 0.0;
  for (iVar2 = 0; first + iVar2 != last; iVar2 = iVar2 + 1) {
    fVar5 = fVar5 + weight[iVar2];
  }
  fVar6 = deRandom_getFloat(&this->m_rnd);
  iVar2 = 0;
  fVar7 = 0.0;
  pIVar3 = last;
  while( true ) {
    pIVar1 = first + iVar2;
    pIVar4 = pIVar3;
    if (pIVar1 == last) break;
    fVar7 = fVar7 + weight[iVar2];
    pIVar4 = pIVar1;
    if (fVar5 * fVar6 + 0.0 < fVar7) break;
    if (0.0 < weight[iVar2]) {
      pIVar3 = pIVar1;
    }
    iVar2 = iVar2 + 1;
  }
  return *pIVar4;
}

Assistant:

T Random::chooseWeighted (InputIter first, InputIter last, WeightIter weight)
{
	// Compute weight sum
	float	weightSum	= 0.0f;
	int		ndx;
	for (ndx = 0; (first + ndx) != last; ndx++)
		weightSum += *(weight + ndx);

	// Random point in 0..weightSum
	float p = getFloat(0.0f, weightSum);

	// Find item in range
	InputIter	lastNonZero	= last;
	float		curWeight	= 0.0f;
	for (ndx = 0; (first + ndx) != last; ndx++)
	{
		float w = *(weight + ndx);

		curWeight += w;

		if (p < curWeight)
			return *(first + ndx);
		else if (w > 0.0f)
			lastNonZero = first + ndx;
	}

	DE_ASSERT(lastNonZero != last);
	return *lastNonZero;
}